

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.hpp
# Opt level: O3

void __thiscall
fidler::ast::
OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>
::OperatorExpression
          (OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>
           *this,OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>
                 *param_1)

{
  pointer pvVar1;
  pointer ppVar2;
  pointer ppVar3;
  
  (this->left).left.op.super_type = (param_1->left).left.op.super_type;
  boost::
  variant<fidler::ast::Identifier,_fidler::ast::CurrentError,_float,_double,_int,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::recursive_wrapper<fidler::ast::Expression>_>
  ::variant(&(this->left).left.expr.base,&(param_1->left).left.expr.base);
  pvVar1 = *(pointer *)
            ((long)&(param_1->left).left.expr.postfix.
                    super__Vector_base<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>,_std::allocator<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  (this->left).left.expr.postfix.
  super__Vector_base<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>,_std::allocator<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->left).left.expr.postfix.
       super__Vector_base<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>,_std::allocator<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->left).left.expr.postfix.
           super__Vector_base<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>,_std::allocator<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>_>_>
           ._M_impl.super__Vector_impl_data + 8) = pvVar1;
  *(pointer *)
   ((long)&(this->left).left.expr.postfix.
           super__Vector_base<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>,_std::allocator<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) =
       *(pointer *)
        ((long)&(param_1->left).left.expr.postfix.
                super__Vector_base<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>,_std::allocator<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>_>_>
                ._M_impl.super__Vector_impl_data + 0x10);
  *(pointer *)
   ((long)&(param_1->left).left.expr.postfix.
           super__Vector_base<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>,_std::allocator<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (param_1->left).left.expr.postfix.
  super__Vector_base<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>,_std::allocator<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(param_1->left).left.expr.postfix.
           super__Vector_base<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>,_std::allocator<boost::variant<fidler::ast::PostfixExpression::MemberAccess,_fidler::ast::PostfixExpression::Subscript>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  ppVar2 = (param_1->left).right.
           super__Vector_base<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>,_std::allocator<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->left).right.
  super__Vector_base<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>,_std::allocator<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->left).right.
       super__Vector_base<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>,_std::allocator<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->left).right.
  super__Vector_base<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>,_std::allocator<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  (this->left).right.
  super__Vector_base<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>,_std::allocator<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->left).right.
       super__Vector_base<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>,_std::allocator<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->left).right.
  super__Vector_base<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>,_std::allocator<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->left).right.
  super__Vector_base<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>,_std::allocator<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->left).right.
  super__Vector_base<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>,_std::allocator<std::pair<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar3 = (param_1->right).
           super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->right).
       super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
  (this->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->right).
       super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->right).
  super__Vector_base<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

OperatorExpression(OperatorExpression&&) = default;